

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O1

void test_pos<wchar_t>(string *source,
                      basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                      *target,string *encoding)

{
  string *psVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar4;
  char *begin;
  wchar_t *begin_00;
  int iVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  method_type mVar8;
  char *pcVar9;
  string *psVar10;
  wchar_t *pwVar11;
  bool bVar12;
  locale l;
  generator g;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  string local_60 [8];
  generator local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  booster::locale::generator::generator(local_58);
  iVar5 = std::__cxx11::string::compare((char *)encoding);
  if (iVar5 == 0) {
    std::operator+(&local_50,"he_IL.",encoding);
    booster::locale::generator::generate(local_60);
  }
  else {
    std::operator+(&local_50,"en_US.",encoding);
    booster::locale::generator::generate(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  pcVar9 = (source->_M_dataplus)._M_p;
  mVar8 = (method_type)encoding;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_80,pcVar9,(string *)(pcVar9 + source->_M_string_length),mVar8);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  paVar4 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source,encoding)==target",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar9 = (source->_M_dataplus)._M_p;
  psVar10 = (string *)(pcVar9 + -1);
  do {
    psVar1 = psVar10 + 1;
    psVar10 = psVar10 + 1;
  } while (*psVar1 != (string)0x0);
  booster::locale::conv::to_utf<wchar_t>((char *)&local_80,pcVar9,psVar10,mVar8);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),encoding)==target",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar9 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_80,pcVar9,(string *)(pcVar9 + source->_M_string_length),mVar8);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target",
               0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar9 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_80,pcVar9,pcVar9 + source->_M_string_length,(locale *)local_60,default_method);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source,l)==target",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  begin = (source->_M_dataplus)._M_p;
  pcVar9 = begin + -1;
  do {
    pcVar2 = pcVar9 + 1;
    pcVar9 = pcVar9 + 1;
  } while (*pcVar2 != '\0');
  booster::locale::conv::to_utf<wchar_t>(&local_80,begin,pcVar9,(locale *)local_60,default_method);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),l)==target",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar9 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_80,pcVar9,pcVar9 + source->_M_string_length,(locale *)local_60,default_method);
  if (local_80._M_string_length == target->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = wmemcmp(local_80._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_80._M_string_length
                     );
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target",0x44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar11 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_80,pwVar11,(string *)(pwVar11 + target->_M_string_length),mVar8);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(target,encoding)==source",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar11 = (target->_M_dataplus)._M_p;
  psVar10 = (string *)(pwVar11 + -1);
  do {
    psVar1 = psVar10 + 4;
    psVar10 = psVar10 + 4;
  } while (*(int *)psVar1 != 0);
  booster::locale::conv::from_utf<wchar_t>((wchar_t *)&local_80,pwVar11,psVar10,mVar8);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(target.c_str(),encoding)==source",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar11 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_80,pwVar11,(string *)(pwVar11 + target->_M_string_length),mVar8);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar11 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_80,pwVar11,pwVar11 + target->_M_string_length,(locale *)local_60,
             default_method);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(target,l)==source",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  begin_00 = (target->_M_dataplus)._M_p;
  pwVar11 = begin_00 + -1;
  do {
    pwVar3 = pwVar11 + 1;
    pwVar11 = pwVar11 + 1;
  } while (*pwVar3 != L'\0');
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_80,begin_00,pwVar11,(locale *)local_60,default_method);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(target.c_str(),l)==source",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar11 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_80,pwVar11,pwVar11 + target->_M_string_length,(locale *)local_60,
             default_method);
  if (local_80._M_string_length == source->_M_string_length) {
    if (local_80._M_string_length == 0) {
      bVar12 = true;
    }
    else {
      iVar5 = bcmp(local_80._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_80._M_string_length);
      bVar12 = iVar5 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source",0x46)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar12 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)&local_80);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale((locale *)local_60);
  booster::locale::generator::~generator(local_58);
  return;
}

Assistant:

void test_pos(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l= encoding == "ISO8859-8" ? g("he_IL."+encoding) : g("en_US."+encoding);
    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TEST(from_utf<Char>(target,encoding)==source);
    TEST(from_utf<Char>(target.c_str(),encoding)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source);
    
    TEST(from_utf<Char>(target,l)==source);
    TEST(from_utf<Char>(target.c_str(),l)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source);
}